

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InterpolateAtSamplePositionCase::
genVertexSource_abi_cxx11_(string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  ostream *poVar1;
  RenderContext *pRVar2;
  ContextType local_1cc;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream buf;
  int numTargetSamples_local;
  InterpolateAtSamplePositionCase *this_local;
  
  buf._372_4_ = numTargetSamples;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,
                           "${GLSL_VERSION_DECL}\n${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}in highp vec4 a_position;\nsample out highp vec2 v_screenPosition;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_screenPosition = (a_position.xy + vec2(1.0, 1.0)) / 2.0 * vec2("
                          );
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x20);
  poVar1 = std::operator<<(poVar1,".0, ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x20);
  std::operator<<(poVar1,".0);\n}\n");
  std::__cxx11::ostringstream::str();
  pRVar2 = gles31::Context::getRenderContext(*(Context **)((long)this + 0x70));
  local_1cc.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1c8,&local_1cc);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string InterpolateAtSamplePositionCase::genVertexSource (int numTargetSamples) const
{
	DE_UNREF(numTargetSamples);

	std::ostringstream buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}"
			"in highp vec4 a_position;\n"
			"sample out highp vec2 v_screenPosition;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = a_position;\n"
			"	v_screenPosition = (a_position.xy + vec2(1.0, 1.0)) / 2.0 * vec2(" << (int)RENDER_SIZE << ".0, " << (int)RENDER_SIZE << ".0);\n"
			"}\n";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}